

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action_score.cc
# Opt level: O2

void ACTION_SCORE::print_action_score
               (int f,v_array<ACTION_SCORE::action_score> *a_s,v_array<char> *param_3)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  size_t i;
  ulong uVar4;
  void *local_1d8;
  ulong local_1d0;
  stringstream ss;
  ostream local_1a8;
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    for (uVar4 = 0; uVar4 < (ulong)((long)a_s->_end - (long)a_s->_begin >> 3); uVar4 = uVar4 + 1) {
      if (uVar4 != 0) {
        std::operator<<(&local_1a8,',');
      }
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      poVar1 = std::operator<<(poVar1,':');
      std::ostream::operator<<(poVar1,a_s->_begin[uVar4].score);
    }
    std::operator<<(&local_1a8,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringbuf::str();
    uVar4 = io_buf::write_file_or_socket(f,local_1d8,local_1d0 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (uVar4 != local_1d0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      poVar1 = std::operator<<(poVar1,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_action_score(int f, v_array<action_score>& a_s, v_array<char>&)
{
  if (f >= 0)
  {
    std::stringstream ss;

    for (size_t i = 0; i < a_s.size(); i++)
    {
      if (i > 0)
        ss << ',';
      ss << a_s[i].action << ':' << a_s[i].score;
    }
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}